

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O3

void mbedtls_net_usleep(unsigned_long usec)

{
  timeval tv;
  timeval local_10;
  
  local_10.tv_sec = usec / 1000000;
  local_10.tv_usec = (long)usec % 1000000;
  select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,&local_10);
  return;
}

Assistant:

void mbedtls_net_usleep( unsigned long usec )
{
#if defined(_WIN32)
    Sleep( ( usec + 999 ) / 1000 );
#else
    struct timeval tv;
    tv.tv_sec  = usec / 1000000;
#if defined(__unix__) || defined(__unix) || \
    ( defined(__APPLE__) && defined(__MACH__) )
    tv.tv_usec = (suseconds_t) usec % 1000000;
#else
    tv.tv_usec = usec % 1000000;
#endif
    select( 0, NULL, NULL, NULL, &tv );
#endif
}